

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucln_cmn.cpp
# Opt level: O2

void ucln_common_registerCleanup_63(ECleanupCommonType type,cleanupFunc *func)

{
  Mutex m;
  Mutex local_20;
  
  if ((uint)type < 0x17) {
    local_20.fMutex = (UMutex *)0x0;
    umtx_lock_63((UMutex *)0x0);
    gCommonCleanupFunctions[(uint)type] = func;
    icu_63::Mutex::~Mutex(&local_20);
  }
  return;
}

Assistant:

U_CFUNC void
ucln_common_registerCleanup(ECleanupCommonType type,
                            cleanupFunc *func)
{
    U_ASSERT(UCLN_COMMON_START < type && type < UCLN_COMMON_COUNT);
    if (UCLN_COMMON_START < type && type < UCLN_COMMON_COUNT)
    {
        icu::Mutex m;     // See ticket 10295 for discussion.
        gCommonCleanupFunctions[type] = func;
    }
#if !UCLN_NO_AUTO_CLEANUP && (defined(UCLN_AUTO_ATEXIT) || defined(UCLN_AUTO_LOCAL))
    ucln_registerAutomaticCleanup();
#endif
}